

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodecTests.cc
# Opt level: O2

const_iterator avro::parsing::skipCalls(Scanner *sc,Decoder *d,const_iterator it,bool isArray)

{
  byte *pbVar1;
  uint uVar2;
  undefined4 *puVar3;
  int iVar4;
  Scanner *this;
  char c;
  uint local_fc;
  _func_int **local_f8;
  undefined **local_f0;
  assertion_result local_e8;
  char *local_d0;
  undefined1 local_c8 [24];
  const_string local_b0;
  lazy_ostream local_a0;
  undefined ***local_90;
  char *local_88;
  const_string local_80;
  const_string local_70;
  const_string local_60;
  const_string local_50;
  const_string local_40;
  
  local_fc = (uint)(byte)((byte)it._M_current ^ 1) << 5 | 0x5d;
  local_f0 = &PTR__lazy_ostream_001ed5f8;
  local_f8 = (_func_int **)&PTR__lazy_ostream_001eda50;
  iVar4 = 0;
  this = sc;
switchD_0018e8f9_caseD_4e:
  pbVar1 = (byte *)sc->p;
  if (pbVar1 == (byte *)sc->end) {
    local_40.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
    ;
    local_40.m_end = "";
    local_50.m_begin = "";
    local_50.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this,&local_40,0x169,&local_50);
    local_e8._0_8_ = local_e8._0_8_ & 0xffffffffffffff00;
    local_e8.m_message.px = (element_type *)0x0;
    local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_a0.m_empty = false;
    local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001eda90;
    local_90 = (undefined ***)&boost::unit_test::lazy_ostream::inst;
    local_88 = "End reached while trying to skip";
    local_60.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
    ;
    local_60.m_end = "";
    boost::test_tools::tt_detail::report_assertion
              (&local_e8,&local_a0,&local_60,0x169,REQUIRE,CHECK_MSG,0);
    boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
    puVar3 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar3 = 0;
    __cxa_throw(puVar3,&int::typeinfo,0);
  }
  sc->p = (char *)(pbVar1 + 1);
  c = *pbVar1;
  uVar2 = (uint)(byte)c;
  switch(c) {
  case 'B':
  case 'D':
  case 'F':
  case 'I':
  case 'L':
    d = (Decoder *)((long)d + 0x20);
    goto switchD_0018e8f9_caseD_4e;
  case 'K':
  case 'S':
  case 'b':
  case 'e':
  case 'f':
    d = (Decoder *)((long)d + 0x20);
  case 'U':
  case 'c':
    this = sc;
    Scanner::extractInt(sc);
  case 'N':
  case 'R':
    goto switchD_0018e8f9_caseD_4e;
  case '[':
switchD_0018e8f9_caseD_5b:
    iVar4 = iVar4 + 1;
    goto switchD_0018e8f9_caseD_4e;
  case ']':
switchD_0018e8f9_caseD_5d:
    if (uVar2 == local_fc && iVar4 == 0) {
      return (const_iterator)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)d;
    }
    iVar4 = iVar4 + -1;
    goto switchD_0018e8f9_caseD_4e;
  default:
    if (uVar2 == 0x73) goto switchD_0018e8f9_caseD_4e;
    if (uVar2 == 0x7d) goto switchD_0018e8f9_caseD_5d;
    if (uVar2 == 0x7b) goto switchD_0018e8f9_caseD_5b;
  case 'C':
  case 'E':
  case 'G':
  case 'H':
  case 'J':
  case 'M':
  case 'O':
  case 'P':
  case 'Q':
  case 'T':
  case 'V':
  case 'W':
  case 'X':
  case 'Y':
  case 'Z':
  case '\\':
  case '^':
  case '_':
  case '`':
  case 'a':
  case 'd':
    local_70.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
    ;
    local_70.m_end = "";
    local_80.m_begin = "";
    local_80.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this,&local_70,0x166,&local_80);
    local_c8[0] = (class_property<bool>)0x0;
    local_c8._8_8_ = (element_type *)0x0;
    local_c8._16_8_ = (sp_counted_base *)0x0;
    local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
    local_e8._0_8_ = local_f0;
    local_e8.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
    local_d0 = "Don\'t know how to skip: ";
    local_a0.m_empty = false;
    local_a0._vptr_lazy_ostream = local_f8;
    local_90 = (undefined ***)&local_e8;
    local_88 = &c;
    local_b0.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
    ;
    local_b0.m_end = "";
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_c8,&local_a0,&local_b0,0x166,REQUIRE,CHECK_MSG,0);
    this = (Scanner *)(local_c8 + 0x10);
    boost::detail::shared_count::~shared_count((shared_count *)this);
    goto switchD_0018e8f9_caseD_4e;
  }
}

Assistant:

static vector<string>::const_iterator skipCalls(Scanner& sc, Decoder& d,
    vector<string>::const_iterator it, bool isArray)
{
    char end = isArray ? ']' : '}';
    int level = 0;
    while (! sc.isDone()) {
        char c = sc.advance();
        switch (c) {
        case '[':
        case '{':
            ++level;
            break;
        case ']':
        case '}':
            if (c == end && level == 0) {
                return it;
            }
            --level;
            break;
        case 'B':
        case 'I':
        case 'L':
        case 'F':
        case 'D':
            ++it;
            break;
        case 'S':
        case 'K':
        case 'b':
        case 'f':
        case 'e':
            ++it;       // Fall through.
        case 'c':
        case 'U':
            sc.extractInt();
            break;
        case 's':
        case 'N':
        case 'R':
            break;
        default:
            BOOST_FAIL("Don't know how to skip: " << c);
        }
    }
    BOOST_FAIL("End reached while trying to skip");
    throw 0;    // Just to keep the compiler happy.
}